

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

RuntimeID __thiscall Jinx::Impl::Parser::VariableNameToRuntimeID(Parser *this,String *name)

{
  RuntimeID __str;
  char *name_00;
  size_type nameLen;
  size_t stackDepth;
  mapped_type *this_00;
  RuntimeID local_20;
  RuntimeID id;
  String *name_local;
  Parser *this_local;
  
  id = (RuntimeID)name;
  name_local = (String *)this;
  name_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                      (name);
  nameLen = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)id);
  stackDepth = VariableStackFrame::GetStackDepthFromName(&this->m_variableStackFrame,(String *)id);
  local_20 = GetVariableId(name_00,nameLen,stackDepth);
  __str = id;
  this_00 = std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
            ::operator[](&this->m_idNameMap,&local_20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
            (this_00,(basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)__str);
  return local_20;
}

Assistant:

inline_t RuntimeID Parser::VariableNameToRuntimeID(const String & name)
	{
		auto id = GetVariableId(name.c_str(), name.size(), m_variableStackFrame.GetStackDepthFromName(name));
		m_idNameMap[id] = name;
		return id;
	}